

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

string * __thiscall
xLearn::Reader::check_file_format_abi_cxx11_(string *__return_storage_ptr__,Reader *this)

{
  char cVar1;
  int iVar2;
  FILE *file;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  size_t i;
  size_type sVar7;
  int i_1;
  Logger local_80;
  allocator local_7a;
  allocator local_79;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  string data_line;
  
  file = OpenFileOrDie((this->filename_)._M_dataplus._M_p,"r");
  data_line._M_dataplus._M_p = (pointer)&data_line.field_2;
  data_line._M_string_length = 0;
  data_line.field_2._M_local_buf[0] = '\0';
  GetLine(file,&data_line);
  Close(file);
  iVar2 = 0;
  iVar5 = 0;
  iVar6 = 0;
  for (sVar7 = 0; data_line._M_string_length != sVar7; sVar7 = sVar7 + 1) {
    cVar1 = data_line._M_dataplus._M_p[sVar7];
    if (cVar1 == '\t') {
      iVar5 = iVar5 + 1;
    }
    else if (cVar1 == ' ') {
      iVar2 = iVar2 + 1;
    }
    else {
      iVar6 = iVar6 + (uint)(cVar1 == ',');
    }
  }
  if ((((iVar5 < iVar2) && (iVar6 < iVar2)) || ((iVar2 < iVar5 && (iVar6 < iVar5)))) ||
     (iVar5 < iVar6 && iVar2 < iVar6)) {
    std::__cxx11::string::assign((char *)&this->splitor_);
  }
  else {
    local_80.severity_ = FATAL;
    std::__cxx11::string::string
              ((string *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.cc"
               ,&local_79);
    std::__cxx11::string::string((string *)&str_list,"check_file_format",&local_7a);
    poVar4 = Logger::Start(FATAL,&local_78,0x4d,(string *)&str_list);
    std::operator<<(poVar4,"File format error!");
    std::__cxx11::string::~string((string *)&str_list);
    std::__cxx11::string::~string((string *)&local_78);
    Logger::~Logger(&local_80);
  }
  str_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  str_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  str_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SplitStringUsing(&data_line,(this->splitor_)._M_dataplus._M_p,&str_list);
  lVar3 = std::__cxx11::string::find
                    ((char *)str_list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,0x147acb);
  this->has_label_ = lVar3 == -1;
  iVar2 = 0;
  for (sVar7 = 0;
      str_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length != sVar7; sVar7 = sVar7 + 1) {
    iVar2 = iVar2 + (uint)(str_list.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p[sVar7] ==
                          ':');
  }
  if (iVar2 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"csv",(allocator *)&local_78);
  }
  else if (iVar2 == 1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"libsvm",(allocator *)&local_78);
  }
  else {
    if (iVar2 != 2) {
      std::__cxx11::string::string((string *)&local_78,"Unknow file format",(allocator *)&local_80);
      Color::print_error(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      exit(0);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,"libffm",(allocator *)&local_78);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&str_list);
  std::__cxx11::string::~string((string *)&data_line);
  return __return_storage_ptr__;
}

Assistant:

std::string Reader::check_file_format() {
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename_.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(filename_.c_str(), "rb");
#endif
  // get the first line of data
  std::string data_line;
  GetLine(file, data_line);
  Close(file);
  // Find the split string
  int space_count = 0;
  int table_count = 0;
  int comma_count = 0;
  for (size_t i = 0; i < data_line.size(); ++i) {
    if (data_line[i] == ' ') {
      space_count++;
    } else if (data_line[i] == '\t') {
      table_count++;
    } else if (data_line[i] == ',') {
      comma_count++;
    }
  }
  if (space_count > table_count && 
      space_count > comma_count) {
    splitor_ = " ";
  } else if (table_count > space_count &&
             table_count > comma_count) {
    splitor_ = "\t";
  } else if (comma_count > space_count &&
             comma_count > table_count) {
    splitor_ = ",";
  } else {
    LOG(FATAL) << "File format error!";
  }
  // Split the first line of data
  std::vector<std::string> str_list;
  SplitStringUsing(data_line, splitor_.c_str(), &str_list);
  // has y?
  size_t found = str_list[0].find(":");
  if (found != std::string::npos) {  // find ":", no label
    has_label_ = false;
  } else {
    has_label_ = true;
  }
  // check file format
  int count = 0;
  for (int i = 0; i < str_list[1].size(); ++i) {
    if (str_list[1][i] == ':') {
      count++;
    }
  }
  if (count == 1) {
    return "libsvm";
  } else if (count == 2) {
    return "libffm";
  } else if (count == 0){
    return "csv";
  }
  Color::print_error("Unknow file format");
  exit(0);
}